

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  UnitTestImpl *this_local;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00191228;
  ForEach<std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>,void(*)(testing::TestSuite*)>
            (&this->test_suites_,Delete<testing::TestSuite>);
  ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
            (&this->environments_,Delete<testing::Environment>);
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  TestEventListeners::~TestEventListeners(&this->listeners_);
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  TypeParameterizedTestSuiteRegistry::~TypeParameterizedTestSuiteRegistry
            (&this->type_parameterized_test_registry_);
  ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
            (&this->parameterized_test_registry_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->test_suite_indices_);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::~vector
            (&this->test_suites_);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::~vector
            (&this->environments_);
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  DefaultPerThreadTestPartResultReporter::~DefaultPerThreadTestPartResultReporter
            (&this->default_per_thread_test_part_result_reporter_);
  DefaultGlobalTestPartResultReporter::~DefaultGlobalTestPartResultReporter
            (&this->default_global_test_part_result_reporter_);
  FilePath::~FilePath(&this->original_working_dir_);
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestSuite.
  ForEach(test_suites_, internal::Delete<TestSuite>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}